

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool __thiscall
el::base::Storage::uninstallCustomFormatSpecifier(Storage *this,char *formatSpecifier)

{
  ScopedLock __s1;
  bool bVar1;
  int iVar2;
  Mutex *pMVar3;
  pointer this_00;
  char *__s2;
  bool bVar4;
  const_iterator local_60;
  __normal_iterator<el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
  local_58 [3];
  CustomFormatSpecifier *local_40;
  __normal_iterator<el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
  local_38;
  __normal_iterator<el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
  local_30;
  iterator it;
  ScopedLock scopedLock;
  char *formatSpecifier_local;
  Storage *this_local;
  
  scopedLock._vptr_NoScopedLock = (_func_int **)formatSpecifier;
  pMVar3 = customFormatSpecifiersLock(this);
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)&it,pMVar3);
  local_38._M_current =
       (CustomFormatSpecifier *)
       utils::std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>::
       begin(&this->m_customFormatSpecifiers);
  local_40 = (CustomFormatSpecifier *)
             utils::std::
             vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>::end
                       (&this->m_customFormatSpecifiers);
  local_30 = std::
             find<__gnu_cxx::__normal_iterator<el::CustomFormatSpecifier*,std::vector<el::CustomFormatSpecifier,std::allocator<el::CustomFormatSpecifier>>>,char_const*>
                       (local_38,(__normal_iterator<el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
                                  )local_40,(char **)&scopedLock);
  local_58[0]._M_current =
       (CustomFormatSpecifier *)
       utils::std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>::
       end(&this->m_customFormatSpecifiers);
  bVar1 = __gnu_cxx::operator!=(&local_30,local_58);
  __s1 = scopedLock;
  bVar4 = false;
  if (bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
              ::operator->(&local_30);
    __s2 = CustomFormatSpecifier::formatSpecifier(this_00);
    iVar2 = strcmp((char *)__s1._vptr_NoScopedLock,__s2);
    bVar4 = iVar2 == 0;
  }
  if (bVar4) {
    __gnu_cxx::
    __normal_iterator<el::CustomFormatSpecifier_const*,std::vector<el::CustomFormatSpecifier,std::allocator<el::CustomFormatSpecifier>>>
    ::__normal_iterator<el::CustomFormatSpecifier*>
              ((__normal_iterator<el::CustomFormatSpecifier_const*,std::vector<el::CustomFormatSpecifier,std::allocator<el::CustomFormatSpecifier>>>
                *)&local_60,&local_30);
    utils::std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>::erase
              (&this->m_customFormatSpecifiers,local_60);
  }
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::~NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)&it);
  return bVar4;
}

Assistant:

bool Storage::uninstallCustomFormatSpecifier(const char* formatSpecifier) {
  base::threading::ScopedLock scopedLock(customFormatSpecifiersLock());
  std::vector<CustomFormatSpecifier>::iterator it = std::find(m_customFormatSpecifiers.begin(),
      m_customFormatSpecifiers.end(), formatSpecifier);
  if (it != m_customFormatSpecifiers.end() && strcmp(formatSpecifier, it->formatSpecifier()) == 0) {
    m_customFormatSpecifiers.erase(it);
    return true;
  }
  return false;
}